

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O1

int units::order(unit *val)

{
  unit_data uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  
  uVar1 = val->base_units_;
  iVar3 = ((int)uVar1 << 0x1c) >> 0x1c;
  iVar2 = -iVar3;
  if (0 < iVar3) {
    iVar2 = iVar3;
  }
  iVar4 = ((int)uVar1 << 0xd) >> 0x1d;
  iVar3 = -iVar4;
  if (0 < iVar4) {
    iVar3 = iVar4;
  }
  iVar5 = ((int)uVar1 << 0x15) >> 0x1d;
  iVar4 = -iVar5;
  if (0 < iVar5) {
    iVar4 = iVar5;
  }
  iVar12 = ((int)uVar1 << 4) >> 0x1e;
  iVar5 = -iVar12;
  if (0 < iVar12) {
    iVar5 = iVar12;
  }
  iVar9 = ((int)uVar1 << 0x12) >> 0x1d;
  iVar12 = -iVar9;
  if (0 < iVar9) {
    iVar12 = iVar9;
  }
  iVar10 = (int)uVar1._0_1_ >> 4;
  iVar9 = -iVar10;
  if (0 < iVar10) {
    iVar9 = iVar10;
  }
  iVar11 = ((int)uVar1 << 6) >> 0x1e;
  iVar10 = -iVar11;
  if (0 < iVar11) {
    iVar10 = iVar11;
  }
  iVar6 = ((int)uVar1 << 8) >> 0x1d;
  iVar11 = -iVar6;
  if (0 < iVar6) {
    iVar11 = iVar6;
  }
  iVar7 = (int)uVar1._0_2_ >> 0xe;
  iVar6 = -iVar7;
  if (0 < iVar7) {
    iVar6 = iVar7;
  }
  iVar8 = ((int)uVar1 << 0xb) >> 0x1e;
  iVar7 = -iVar8;
  if (0 < iVar8) {
    iVar7 = iVar8;
  }
  return iVar7 + iVar6 + iVar11 + iVar10 + iVar9 + iVar12 + iVar5 + iVar4 + iVar3 + iVar2;
}

Assistant:

constexpr detail::unit_data base_units() const { return base_units_; }